

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

BinsSelectExpr *
slang::ast::SetExprBinsSelectExpr::fromSyntax
          (SimpleBinsSelectExprSyntax *syntax,ASTContext *context)

{
  Scope *pSVar1;
  Compilation *this;
  Symbol *pSVar2;
  ExpressionSyntax *pEVar3;
  Symbol *pSVar4;
  basic_string_view<char,_std::char_traits<char>_> __y;
  undefined1 auVar5 [16];
  bool bVar6;
  BinsSelectExpr *pBVar7;
  Expression *pEVar8;
  SetExprBinsSelectExpr *pSVar9;
  string_view __x;
  SourceRange sourceRange;
  Expression *matches;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffc8;
  Expression *local_30;
  
  pSVar1 = (context->scope).ptr;
  this = pSVar1->compilation;
  pSVar2 = pSVar1->thisSym;
  pEVar3 = (syntax->expr).ptr;
  if ((pEVar3->super_SyntaxNode).kind == IdentifierName) {
    pSVar4 = pSVar2->parentScope->thisSym;
    __x = parsing::Token::valueText((Token *)(pEVar3 + 1));
    __y._M_len = (pSVar4->name)._M_len;
    __y._M_str = (pSVar4->name)._M_str;
    bVar6 = std::operator==(__x,__y);
    if (bVar6) {
      if (syntax->matchesClause != (MatchesClauseSyntax *)0x0) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange
                                (&syntax->matchesClause->super_SyntaxNode);
        ASTContext::addDiag(context,(DiagCode)0x610007,sourceRange);
      }
      pBVar7 = &BumpAllocator::emplace<slang::ast::CrossIdBinsSelectExpr>
                          (&this->super_BumpAllocator)->super_BinsSelectExpr;
      return pBVar7;
    }
  }
  local_30 = (Expression *)0x0;
  if (syntax->matchesClause != (MatchesClauseSyntax *)0x0) {
    pEVar8 = bindCovergroupExpr(*(ExpressionSyntax **)
                                 &(syntax->matchesClause->pattern).ptr[1].super_SyntaxNode,context,
                                (Type *)0x0,(bitmask<slang::ast::ASTFlags>)0x200);
    local_30 = pEVar8;
    bVar6 = Expression::bad(pEVar8);
    if (!bVar6) {
      bVar6 = Type::isUnbounded((pEVar8->type).ptr);
      if (!bVar6) {
        ASTContext::requireIntegral(context,pEVar8);
      }
    }
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = context;
  pEVar8 = Expression::bindRValue
                     ((Expression *)pSVar2[1].originatingSyntax,(Type *)(syntax->expr).ptr,
                      (ExpressionSyntax *)0x0,(SourceRange)(auVar5 << 0x40),(ASTContext *)0x0,
                      in_stack_ffffffffffffffc8);
  pSVar9 = BumpAllocator::
           emplace<slang::ast::SetExprBinsSelectExpr,slang::ast::Expression_const&,slang::ast::Expression_const*&>
                     (&this->super_BumpAllocator,pEVar8,&local_30);
  return &pSVar9->super_BinsSelectExpr;
}

Assistant:

BinsSelectExpr& SetExprBinsSelectExpr::fromSyntax(const SimpleBinsSelectExprSyntax& syntax,
                                                  const ASTContext& context) {
    auto& body = context.scope->asSymbol().as<CoverCrossBodySymbol>();
    SLANG_ASSERT(body.crossQueueType);

    auto parent = body.getParentScope();
    SLANG_ASSERT(parent);

    // If the syntax is a simple identifier that names our parent cross,
    // we're selecting the whole cross (which is otherwise not an expression).
    auto& comp = context.getCompilation();
    auto& cross = parent->asSymbol().as<CoverCrossSymbol>();
    if (syntax.expr->kind == SyntaxKind::IdentifierName &&
        syntax.expr->as<IdentifierNameSyntax>().identifier.valueText() == cross.name) {

        if (syntax.matchesClause)
            context.addDiag(diag::InvalidBinsMatches, syntax.matchesClause->sourceRange());

        return *comp.emplace<CrossIdBinsSelectExpr>();
    }

    const Expression* matches = nullptr;
    if (syntax.matchesClause) {
        matches =
            &bindCovergroupExpr(*syntax.matchesClause->pattern->as<ExpressionPatternSyntax>().expr,
                                context, nullptr, ASTFlags::AllowUnboundedLiteral);
        if (!matches->bad() && !matches->type->isUnbounded())
            context.requireIntegral(*matches);
    }

    auto& expr = Expression::bindRValue(*body.crossQueueType, *syntax.expr, {}, context);
    return *comp.emplace<SetExprBinsSelectExpr>(expr, matches);
}